

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nukedopl3.cpp
# Opt level: O3

void chan_writea0(opl_channel *channel,Bit8u data)

{
  undefined1 uVar1;
  opl_slot *poVar2;
  opl_channel *poVar3;
  opl_channel *poVar4;
  Bit8u BVar5;
  short sVar6;
  uint uVar7;
  
  if ((channel->chip->newm == '\0') || (channel->chtype != '\x02')) {
    uVar7 = (uint)data | channel->f_num & 0x300;
    channel->f_num = (Bit16u)uVar7;
    uVar1 = channel->block;
    channel->ksv = ((uVar7 >> ((byte)(9 - channel->chip->nts) & 0x1f) & 1) != 0) + uVar1 * '\x02';
    poVar2 = channel->slots[0];
    sVar6 = (ushort)poVar2->channel->block * 0x20 + (ushort)""[poVar2->channel->f_num >> 6] * 4 +
            -0x100;
    BVar5 = (Bit8u)sVar6;
    if (sVar6 < 1) {
      BVar5 = '\0';
    }
    poVar2->eg_ksl = BVar5;
    poVar3 = channel->slots[1]->channel;
    sVar6 = (ushort)poVar3->block * 0x20 + (ushort)""[poVar3->f_num >> 6] * 4 + -0x100;
    if (sVar6 < 1) {
      sVar6 = 0;
    }
    channel->slots[1]->eg_ksl = (Bit8u)sVar6;
    envelope_update_rate(poVar2);
    envelope_update_rate(channel->slots[1]);
    if ((channel->chip->newm != '\0') && (channel->chtype == '\x01')) {
      poVar3 = channel->pair;
      poVar3->f_num = channel->f_num;
      poVar3->ksv = channel->ksv;
      poVar2 = poVar3->slots[0];
      sVar6 = (ushort)poVar2->channel->block * 0x20 + (ushort)""[poVar2->channel->f_num >> 6] * 4 +
              -0x100;
      BVar5 = (Bit8u)sVar6;
      if (sVar6 < 1) {
        BVar5 = '\0';
      }
      poVar2->eg_ksl = BVar5;
      poVar4 = poVar3->slots[1]->channel;
      sVar6 = (ushort)poVar4->block * 0x20 + (ushort)""[poVar4->f_num >> 6] * 4 + -0x100;
      BVar5 = (Bit8u)sVar6;
      if (sVar6 < 1) {
        BVar5 = '\0';
      }
      poVar3->slots[1]->eg_ksl = BVar5;
      envelope_update_rate(poVar2);
      envelope_update_rate(channel->pair->slots[1]);
      return;
    }
  }
  return;
}

Assistant:

void chan_writea0(opl_channel *channel, Bit8u data) {
	if (channel->chip->newm && channel->chtype == ch_4op2) {
		return;
	}
	channel->f_num = (channel->f_num & 0x300) | data;
	channel->ksv = (channel->block << 1) | ((channel->f_num >> (0x09 - channel->chip->nts)) & 0x01);
	envelope_update_ksl(channel->slots[0]);
	envelope_update_ksl(channel->slots[1]);
	envelope_update_rate(channel->slots[0]);
	envelope_update_rate(channel->slots[1]);
	if (channel->chip->newm && channel->chtype == ch_4op) {
		channel->pair->f_num = channel->f_num;
		channel->pair->ksv = channel->ksv;
		envelope_update_ksl(channel->pair->slots[0]);
		envelope_update_ksl(channel->pair->slots[1]);
		envelope_update_rate(channel->pair->slots[0]);
		envelope_update_rate(channel->pair->slots[1]);
	}
}